

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

int Abc_SuppSolve(Vec_Wrd_t *p,int nVars)

{
  int iVar1;
  abctime aVar2;
  Vec_Wrd_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Wec_t *p_02;
  int *pCounts_00;
  word i_00;
  abctime aVar3;
  int *pCounts;
  int nVarsNew;
  int iVar;
  int v;
  int i;
  word Entry;
  Vec_Wec_t *vDoubles;
  Vec_Wec_t *vSingles;
  Vec_Wrd_t *pNew;
  abctime clk;
  int nVars_local;
  Vec_Wrd_t *p_local;
  
  aVar2 = Abc_Clock();
  p_00 = Vec_WrdDup(p);
  p_01 = Vec_WecStart(0x40);
  p_02 = Vec_WecStart(0x40);
  iVar1 = Vec_WrdSize(p);
  pCounts_00 = (int *)malloc((long)iVar1 << 2);
  for (iVar = 0; iVar1 = Vec_WrdSize(p), iVar < iVar1; iVar = iVar + 1) {
    i_00 = Vec_WrdEntry(p,iVar);
    iVar1 = Abc_SuppCountOnes64(i_00);
    pCounts_00[iVar] = iVar1;
    if (pCounts_00[iVar] == 1) {
      for (nVarsNew = 0; nVarsNew < nVars; nVarsNew = nVarsNew + 1) {
        if ((i_00 >> ((byte)nVarsNew & 0x3f) & 1) != 0) {
          Vec_WecPush(p_01,nVarsNew,iVar);
        }
      }
    }
    else if (pCounts_00[iVar] == 2) {
      for (nVarsNew = 0; nVarsNew < nVars; nVarsNew = nVarsNew + 1) {
        if ((i_00 >> ((byte)nVarsNew & 0x3f) & 1) != 0) {
          Vec_WecPush(p_02,nVarsNew,iVar);
        }
      }
    }
  }
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  pCounts._0_4_ = nVars;
  while (iVar1 = Abc_SuppFindVar(p_01,p_02,nVars), iVar1 != -1) {
    Abc_SuppRemove(p_00,pCounts_00,p_01,p_02,iVar1,nVars);
    pCounts._0_4_ = (int)pCounts + -1;
  }
  Vec_WecFree(p_01);
  Vec_WecFree(p_02);
  Vec_WrdFree(p_00);
  if (pCounts_00 != (int *)0x0) {
    free(pCounts_00);
  }
  return (int)pCounts;
}

Assistant:

int Abc_SuppSolve( Vec_Wrd_t * p, int nVars )
{
    abctime clk = Abc_Clock();
    Vec_Wrd_t * pNew = Vec_WrdDup( p );
    Vec_Wec_t * vSingles = Vec_WecStart( 64 );
    Vec_Wec_t * vDoubles = Vec_WecStart( 64 );
    word Entry; int i, v, iVar, nVarsNew = nVars;
    int * pCounts = ABC_ALLOC( int, Vec_WrdSize(p) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        pCounts[i] = Abc_SuppCountOnes64( Entry );
        if ( pCounts[i] == 1 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( vSingles, v, i );
        }
        else if ( pCounts[i] == 2 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( vDoubles, v, i );
        }
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_SuppProfile( vSingles, vDoubles, nVars );
    // find variable in 0 singles and the smallest doubles
    while ( 1 )
    {
        iVar = Abc_SuppFindVar( vSingles, vDoubles, nVars );
        if ( iVar == -1 )
            break;
//        printf( "Selected variable %d.\n", iVar );
        Abc_SuppRemove( pNew, pCounts, vSingles, vDoubles, iVar, nVars );
//        Abc_SuppProfile( vSingles, vDoubles, nVars );
        nVarsNew--;
    }
//    printf( "Result = %d (out of %d)\n", nVarsNew, nVars );
    Vec_WecFree( vSingles );
    Vec_WecFree( vDoubles );
    Vec_WrdFree( pNew );
    ABC_FREE( pCounts );
    return nVarsNew;
}